

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  char *__s1;
  int iVar1;
  ValueHolder *pVVar2;
  undefined8 uVar3;
  GTestLog local_14;
  
  if (base == (ThreadLocalValueHolderBase *)0x0) {
    uVar3 = __cxa_bad_typeid();
    GTestLog::~GTestLog(&local_14);
    _Unwind_Resume(uVar3);
  }
  __s1 = *(char **)(base->_vptr_ThreadLocalValueHolderBase[-1] + 8);
  if (__s1 != "N7testing8internal11ThreadLocalISt6vectorINS0_9TraceInfoESaIS3_EEE11ValueHolderE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,
                     "N7testing8internal11ThreadLocalISt6vectorINS0_9TraceInfoESaIS3_EEE11ValueHolderE"
                    );
      if (iVar1 == 0) goto LAB_0027edce;
    }
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O1/tests/googletest-prefix/src/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_14);
  }
LAB_0027edce:
  pVVar2 = (ValueHolder *)
           __dynamic_cast(base,&ThreadLocalValueHolderBase::typeinfo,
                          &ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>
                           ::ValueHolder::typeinfo,0);
  return pVVar2;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}